

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

void __thiscall
Diligent::TexFormatToViewFormatConverter::TexFormatToViewFormatConverter
          (TexFormatToViewFormatConverter *this)

{
  reference pvVar1;
  reference pvVar2;
  array<Diligent::TEXTURE_FORMAT,_6UL> *local_18;
  TexFormatToViewFormatConverter *this_local;
  
  memset(this,0,0x4f8);
  local_18 = (array<Diligent::TEXTURE_FORMAT,_6UL> *)this;
  do {
    local_18 = local_18 + 1;
  } while ((TexFormatToViewFormatConverter *)local_18 != this + 1);
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,1);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_RGBA32_FLOAT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,1);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_RGBA32_FLOAT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,1);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,1);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,1);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_RGBA32_FLOAT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,2);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_RGBA32_FLOAT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,2);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_RGBA32_FLOAT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,2);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,2);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,2);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_RGBA32_FLOAT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,3);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_RGBA32_UINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,3);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_RGBA32_UINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,3);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,3);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,3);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_RGBA32_UINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,4);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_RGBA32_SINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,4);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_RGBA32_SINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,4);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,4);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,4);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_RGBA32_SINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,5);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_RGB32_FLOAT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,5);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_RGB32_FLOAT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,5);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,5);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,5);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_RGB32_FLOAT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,6);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_RGB32_FLOAT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,6);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_RGB32_FLOAT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,6);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,6);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,6);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_RGB32_FLOAT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,7);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_RGB32_UINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,7);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_RGB32_UINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,7);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,7);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,7);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_RGB32_UINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,8);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_RGB32_SINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,8);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_RGB32_SINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,8);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,8);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,8);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_RGB32_SINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,9);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_RGBA16_FLOAT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,9);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_RGBA16_FLOAT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,9);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,9);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,9);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_RGBA16_FLOAT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,10);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_RGBA16_FLOAT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,10);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_RGBA16_FLOAT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,10);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,10);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,10);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_RGBA16_FLOAT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0xb);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_RGBA16_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0xb);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_RGBA16_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0xb);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0xb);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0xb);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_RGBA16_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0xc);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_RGBA16_UINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0xc);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_RGBA16_UINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0xc);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0xc);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0xc);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_RGBA16_UINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0xd);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_RGBA16_SNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0xd);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_RGBA16_SNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0xd);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0xd);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0xd);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_RGBA16_SNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0xe);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_RGBA16_SINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0xe);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_RGBA16_SINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0xe);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0xe);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0xe);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_RGBA16_SINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0xf);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_RG32_FLOAT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0xf);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_RG32_FLOAT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0xf);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0xf);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0xf);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_RG32_FLOAT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x10);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_RG32_FLOAT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x10);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_RG32_FLOAT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x10);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x10);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x10);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_RG32_FLOAT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x11);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_RG32_UINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x11);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_RG32_UINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x11);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x11);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x11);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_RG32_UINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x12);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_RG32_SINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x12);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_RG32_SINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x12);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x12);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x12);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_RG32_SINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x13);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_R32_FLOAT_X8X24_TYPELESS;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x13);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x13);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_D32_FLOAT_S8X24_UINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x13);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_D32_FLOAT_S8X24_UINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x13);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x14);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_R32_FLOAT_X8X24_TYPELESS;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x14);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x14);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_D32_FLOAT_S8X24_UINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x14);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_D32_FLOAT_S8X24_UINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x14);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x15);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_R32_FLOAT_X8X24_TYPELESS;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x15);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x15);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_D32_FLOAT_S8X24_UINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x15);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_D32_FLOAT_S8X24_UINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x15);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_R32_FLOAT_X8X24_TYPELESS;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x16);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_X32_TYPELESS_G8X24_UINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x16);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x16);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_D32_FLOAT_S8X24_UINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x16);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_D32_FLOAT_S8X24_UINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x16);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_X32_TYPELESS_G8X24_UINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x17);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_RGB10A2_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x17);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_RGB10A2_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x17);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x17);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x17);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_RGB10A2_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x18);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_RGB10A2_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x18);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_RGB10A2_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x18);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x18);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x18);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_RGB10A2_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x19);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_RGB10A2_UINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x19);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_RGB10A2_UINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x19);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x19);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x19);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_RGB10A2_UINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x1a);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_R11G11B10_FLOAT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x1a);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_R11G11B10_FLOAT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x1a);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x1a);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x1a);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_R11G11B10_FLOAT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x1b);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_RGBA8_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x1b);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_RGBA8_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x1b);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x1b);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x1b);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_RGBA8_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x1c);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_RGBA8_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x1c);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_RGBA8_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x1c);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x1c);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x1c);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_RGBA8_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x1d);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_RGBA8_UNORM_SRGB;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x1d);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_RGBA8_UNORM_SRGB;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x1d);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x1d);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x1d);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_RGBA8_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x1e);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_RGBA8_UINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x1e);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_RGBA8_UINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x1e);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x1e);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x1e);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_RGBA8_UINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x1f);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_RGBA8_SNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x1f);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_RGBA8_SNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x1f);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x1f);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x1f);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_RGBA8_SNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x20);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_RGBA8_SINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x20);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_RGBA8_SINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x20);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x20);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x20);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_RGBA8_SINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x21);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_RG16_FLOAT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x21);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_RG16_FLOAT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x21);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x21);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x21);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_RG16_FLOAT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x22);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_RG16_FLOAT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x22);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_RG16_FLOAT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x22);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x22);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x22);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_RG16_FLOAT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x23);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_RG16_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x23);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_RG16_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x23);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x23);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x23);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_RG16_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x24);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_RG16_UINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x24);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_RG16_UINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x24);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x24);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x24);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_RG16_UINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x25);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_RG16_SNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x25);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_RG16_SNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x25);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x25);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x25);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_RG16_SNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x26);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_RG16_SINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x26);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_RG16_SINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x26);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x26);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x26);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_RG16_SINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x27);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_R32_FLOAT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x27);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_R32_FLOAT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x27);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_D32_FLOAT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x27);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_D32_FLOAT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x27);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_R32_FLOAT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x28);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_R32_FLOAT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x28);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_R32_FLOAT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x28);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_D32_FLOAT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x28);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_D32_FLOAT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x28);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_R32_FLOAT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x29);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_R32_FLOAT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x29);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_R32_FLOAT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x29);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_D32_FLOAT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x29);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_D32_FLOAT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x29);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_R32_FLOAT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x2a);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_R32_UINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x2a);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_R32_UINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x2a);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x2a);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x2a);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_R32_UINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x2b);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_R32_SINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x2b);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_R32_SINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x2b);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x2b);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x2b);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_R32_SINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x2c);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_R24_UNORM_X8_TYPELESS;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x2c);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x2c);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_D24_UNORM_S8_UINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x2c);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_D24_UNORM_S8_UINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x2c);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x2d);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_R24_UNORM_X8_TYPELESS;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x2d);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x2d);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_D24_UNORM_S8_UINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x2d);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_D24_UNORM_S8_UINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x2d);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x2e);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_R24_UNORM_X8_TYPELESS;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x2e);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x2e);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_D24_UNORM_S8_UINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x2e);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_D24_UNORM_S8_UINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x2e);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_R24_UNORM_X8_TYPELESS;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x2f);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_X24_TYPELESS_G8_UINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x2f);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x2f);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_D24_UNORM_S8_UINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x2f);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_D24_UNORM_S8_UINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x2f);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_X24_TYPELESS_G8_UINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x30);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_RG8_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x30);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_RG8_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x30);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x30);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x30);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_RG8_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x31);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_RG8_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x31);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_RG8_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x31);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x31);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x31);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_RG8_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x32);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_RG8_UINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x32);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_RG8_UINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x32);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x32);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x32);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_RG8_UINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x33);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_RG8_SNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x33);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_RG8_SNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x33);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x33);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x33);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_RG8_SNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x34);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_RG8_SINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x34);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_RG8_SINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x34);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x34);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x34);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_RG8_SINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x35);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_R16_FLOAT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x35);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_R16_FLOAT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x35);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x35);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x35);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_R16_FLOAT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x36);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_R16_FLOAT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x36);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_R16_FLOAT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x36);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x36);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x36);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_R16_FLOAT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x37);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_R16_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x37);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_R16_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x37);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_D16_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x37);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_D16_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x37);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_R16_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x38);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_R16_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x38);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_R16_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x38);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_D16_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x38);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_D16_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x38);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_R16_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x39);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_R16_UINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x39);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_R16_UINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x39);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x39);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x39);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_R16_UINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x3a);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_R16_SNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x3a);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_R16_SNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x3a);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x3a);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x3a);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_R16_SNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x3b);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_R16_SINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x3b);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_R16_SINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x3b);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x3b);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x3b);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_R16_SINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x3c);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_R8_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x3c);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_R8_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x3c);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x3c);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x3c);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_R8_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x3d);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_R8_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x3d);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_R8_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x3d);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x3d);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x3d);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_R8_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x3e);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_R8_UINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x3e);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_R8_UINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x3e);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x3e);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x3e);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_R8_UINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x3f);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_R8_SNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x3f);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_R8_SNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x3f);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x3f);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x3f);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_R8_SNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x40);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_R8_SINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x40);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_R8_SINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x40);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x40);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x40);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_R8_SINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x41);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_A8_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x41);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_A8_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x41);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x41);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x41);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_A8_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x42);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_R1_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x42);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_R1_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x42);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x42);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x42);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_R1_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x43);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_RGB9E5_SHAREDEXP;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x43);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_RGB9E5_SHAREDEXP;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x43);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x43);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x43);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_RGB9E5_SHAREDEXP;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x44);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_RG8_B8G8_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x44);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_RG8_B8G8_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x44);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x44);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x44);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_RG8_B8G8_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x45);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_G8R8_G8B8_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x45);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_G8R8_G8B8_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x45);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x45);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x45);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_G8R8_G8B8_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x46);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_BC1_UNORM_SRGB;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x46);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x46);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x46);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x46);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x47);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_BC1_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x47);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x47);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x47);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x47);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x48);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_BC1_UNORM_SRGB;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x48);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x48);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x48);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x48);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x49);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_BC2_UNORM_SRGB;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x49);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x49);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x49);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x49);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x4a);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_BC2_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x4a);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x4a);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x4a);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x4a);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x4b);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_BC2_UNORM_SRGB;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x4b);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x4b);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x4b);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x4b);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x4c);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_BC3_UNORM_SRGB;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x4c);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x4c);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x4c);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x4c);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x4d);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_BC3_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x4d);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x4d);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x4d);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x4d);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x4e);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_BC3_UNORM_SRGB;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x4e);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x4e);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x4e);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x4e);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x4f);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_BC4_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x4f);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x4f);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x4f);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x4f);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x50);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_BC4_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x50);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x50);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x50);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x50);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x51);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_BC4_SNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x51);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x51);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x51);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x51);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x52);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_BC5_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x52);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x52);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x52);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x52);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x53);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_BC5_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x53);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x53);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x53);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x53);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x54);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_BC5_SNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x54);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x54);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x54);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x54);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x55);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_B5G6R5_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x55);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_B5G6R5_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x55);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x55);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x55);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_B5G6R5_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x56);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_B5G5R5A1_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x56);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_B5G5R5A1_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x56);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x56);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x56);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_B5G5R5A1_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x57);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_BGRA8_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x57);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_BGRA8_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x57);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x57);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x57);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_BGRA8_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x58);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_BGRX8_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x58);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_BGRX8_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x58);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x58);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x58);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_BGRX8_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x59);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_R10G10B10_XR_BIAS_A2_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x59);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x59);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x59);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x59);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x5a);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_BGRA8_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x5a);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_BGRA8_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x5a);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x5a);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x5a);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_BGRA8_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x5b);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_BGRA8_UNORM_SRGB;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x5b);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_BGRA8_UNORM_SRGB;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x5b);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x5b);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x5b);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_BGRA8_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x5c);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_BGRX8_UNORM_SRGB;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x5c);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_BGRX8_UNORM_SRGB;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x5c);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x5c);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x5c);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_BGRX8_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x5d);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_BGRX8_UNORM_SRGB;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x5d);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_BGRX8_UNORM_SRGB;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x5d);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x5d);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x5d);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_BGRX8_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x5e);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_BC6H_UF16;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x5e);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x5e);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x5e);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x5e);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x5f);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_BC6H_UF16;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x5f);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x5f);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x5f);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x5f);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x60);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_BC6H_SF16;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x60);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x60);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x60);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x60);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x61);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_BC7_UNORM_SRGB;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x61);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x61);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x61);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x61);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x62);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_BC7_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x62);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x62);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x62);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x62);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,99);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_BC7_UNORM_SRGB;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,99);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,99);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,99);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,99);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,100);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_ETC2_RGB8_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,100);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,100);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,100);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,100);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x65);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_ETC2_RGB8_UNORM_SRGB;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x65);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x65);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x65);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x65);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x66);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_ETC2_RGB8A1_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x66);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x66);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x66);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x66);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x67);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_ETC2_RGB8A1_UNORM_SRGB;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x67);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x67);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x67);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x67);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x68);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_ETC2_RGBA8_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x68);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x68);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x68);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x68);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x69);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,0);
  *pvVar2 = TEX_FORMAT_ETC2_RGBA8_UNORM_SRGB;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x69);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,1);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x69);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,2);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x69);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,3);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x69);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,4);
  *pvVar2 = TEX_FORMAT_UNKNOWN;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x3c);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,5);
  *pvVar2 = TEX_FORMAT_R8_UINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x3e);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,5);
  *pvVar2 = TEX_FORMAT_R8_UINT;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x30);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,5);
  *pvVar2 = TEX_FORMAT_RG8_UNORM;
  pvVar1 = std::array<std::array<Diligent::TEXTURE_FORMAT,_6UL>,_106UL>::operator[]
                     (&this->m_ViewFormats,0x31);
  pvVar2 = std::array<Diligent::TEXTURE_FORMAT,_6UL>::operator[](pvVar1,5);
  *pvVar2 = TEX_FORMAT_RG8_UNORM;
  return;
}

Assistant:

TexFormatToViewFormatConverter()
    {
        // clang-format off
#define INIT_TEX_VIEW_FORMAT_INFO(TexFmt, SRVFmt, RTVFmt, DSVFmt, UAVFmt)\
        {\
            m_ViewFormats[TexFmt][TEXTURE_VIEW_SHADER_RESOURCE-1]         = TEX_FORMAT_##SRVFmt; \
            m_ViewFormats[TexFmt][TEXTURE_VIEW_RENDER_TARGET-1]           = TEX_FORMAT_##RTVFmt; \
            m_ViewFormats[TexFmt][TEXTURE_VIEW_DEPTH_STENCIL-1]           = TEX_FORMAT_##DSVFmt; \
            m_ViewFormats[TexFmt][TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL-1] = TEX_FORMAT_##DSVFmt; \
            m_ViewFormats[TexFmt][TEXTURE_VIEW_UNORDERED_ACCESS-1]        = TEX_FORMAT_##UAVFmt; \
        }
        static_assert(TEXTURE_VIEW_NUM_VIEWS == 7, "Please handle the new view type above, if necessary");

        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_UNKNOWN,                 UNKNOWN, UNKNOWN, UNKNOWN, UNKNOWN);

        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RGBA32_TYPELESS,         RGBA32_FLOAT, RGBA32_FLOAT, UNKNOWN, RGBA32_FLOAT);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RGBA32_FLOAT,            RGBA32_FLOAT, RGBA32_FLOAT, UNKNOWN, RGBA32_FLOAT);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RGBA32_UINT,             RGBA32_UINT,  RGBA32_UINT,  UNKNOWN, RGBA32_UINT);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RGBA32_SINT,             RGBA32_SINT,  RGBA32_SINT,  UNKNOWN, RGBA32_SINT);

        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RGB32_TYPELESS,          RGB32_FLOAT, RGB32_FLOAT, UNKNOWN, RGB32_FLOAT);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RGB32_FLOAT,             RGB32_FLOAT, RGB32_FLOAT, UNKNOWN, RGB32_FLOAT);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RGB32_UINT,              RGB32_UINT,  RGB32_UINT,  UNKNOWN, RGB32_UINT);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RGB32_SINT,              RGB32_SINT,  RGB32_SINT,  UNKNOWN, RGB32_SINT);

        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RGBA16_TYPELESS,         RGBA16_FLOAT, RGBA16_FLOAT, UNKNOWN, RGBA16_FLOAT);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RGBA16_FLOAT,            RGBA16_FLOAT, RGBA16_FLOAT, UNKNOWN, RGBA16_FLOAT);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RGBA16_UNORM,            RGBA16_UNORM, RGBA16_UNORM, UNKNOWN, RGBA16_UNORM);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RGBA16_UINT,             RGBA16_UINT,  RGBA16_UINT,  UNKNOWN, RGBA16_UINT);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RGBA16_SNORM,            RGBA16_SNORM, RGBA16_SNORM, UNKNOWN, RGBA16_SNORM);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RGBA16_SINT,             RGBA16_SINT,  RGBA16_SINT,  UNKNOWN, RGBA16_SINT);

        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RG32_TYPELESS,           RG32_FLOAT, RG32_FLOAT, UNKNOWN, RG32_FLOAT);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RG32_FLOAT,              RG32_FLOAT, RG32_FLOAT, UNKNOWN, RG32_FLOAT);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RG32_UINT,               RG32_UINT,  RG32_UINT,  UNKNOWN, RG32_UINT);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RG32_SINT,               RG32_SINT,  RG32_SINT,  UNKNOWN, RG32_SINT);

        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_R32G8X24_TYPELESS,       R32_FLOAT_X8X24_TYPELESS, UNKNOWN, D32_FLOAT_S8X24_UINT, UNKNOWN);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_D32_FLOAT_S8X24_UINT,    R32_FLOAT_X8X24_TYPELESS, UNKNOWN, D32_FLOAT_S8X24_UINT, UNKNOWN);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_R32_FLOAT_X8X24_TYPELESS,R32_FLOAT_X8X24_TYPELESS, UNKNOWN, D32_FLOAT_S8X24_UINT, R32_FLOAT_X8X24_TYPELESS);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_X32_TYPELESS_G8X24_UINT, X32_TYPELESS_G8X24_UINT,  UNKNOWN, D32_FLOAT_S8X24_UINT, X32_TYPELESS_G8X24_UINT);

        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RGB10A2_TYPELESS,        RGB10A2_UNORM, RGB10A2_UNORM, UNKNOWN, RGB10A2_UNORM);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RGB10A2_UNORM,           RGB10A2_UNORM, RGB10A2_UNORM, UNKNOWN, RGB10A2_UNORM);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RGB10A2_UINT,            RGB10A2_UINT,  RGB10A2_UINT,  UNKNOWN, RGB10A2_UINT);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_R11G11B10_FLOAT,         R11G11B10_FLOAT, R11G11B10_FLOAT, UNKNOWN, R11G11B10_FLOAT);

        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RGBA8_TYPELESS,          RGBA8_UNORM,      RGBA8_UNORM,      UNKNOWN, RGBA8_UNORM);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RGBA8_UNORM,             RGBA8_UNORM,      RGBA8_UNORM,      UNKNOWN, RGBA8_UNORM);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RGBA8_UNORM_SRGB,        RGBA8_UNORM_SRGB, RGBA8_UNORM_SRGB, UNKNOWN, RGBA8_UNORM);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RGBA8_UINT,              RGBA8_UINT,       RGBA8_UINT,       UNKNOWN, RGBA8_UINT);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RGBA8_SNORM,             RGBA8_SNORM,      RGBA8_SNORM,      UNKNOWN, RGBA8_SNORM);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RGBA8_SINT,              RGBA8_SINT,       RGBA8_SINT,       UNKNOWN, RGBA8_SINT);

        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RG16_TYPELESS,           RG16_FLOAT, RG16_FLOAT, UNKNOWN, RG16_FLOAT);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RG16_FLOAT,              RG16_FLOAT, RG16_FLOAT, UNKNOWN, RG16_FLOAT);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RG16_UNORM,              RG16_UNORM, RG16_UNORM, UNKNOWN, RG16_UNORM);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RG16_UINT,               RG16_UINT,  RG16_UINT,  UNKNOWN, RG16_UINT);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RG16_SNORM,              RG16_SNORM, RG16_SNORM, UNKNOWN, RG16_SNORM);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RG16_SINT,               RG16_SINT,  RG16_SINT,  UNKNOWN, RG16_SINT);

        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_R32_TYPELESS,            R32_FLOAT, R32_FLOAT, D32_FLOAT, R32_FLOAT);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_D32_FLOAT,               R32_FLOAT, R32_FLOAT, D32_FLOAT, R32_FLOAT);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_R32_FLOAT,               R32_FLOAT, R32_FLOAT, D32_FLOAT, R32_FLOAT);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_R32_UINT,                R32_UINT,  R32_UINT,  UNKNOWN,   R32_UINT);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_R32_SINT,                R32_SINT,  R32_SINT,  UNKNOWN,   R32_SINT);

        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_R24G8_TYPELESS,          R24_UNORM_X8_TYPELESS, UNKNOWN, D24_UNORM_S8_UINT, UNKNOWN);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_D24_UNORM_S8_UINT,       R24_UNORM_X8_TYPELESS, UNKNOWN, D24_UNORM_S8_UINT, UNKNOWN);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_R24_UNORM_X8_TYPELESS,   R24_UNORM_X8_TYPELESS, UNKNOWN, D24_UNORM_S8_UINT, R24_UNORM_X8_TYPELESS);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_X24_TYPELESS_G8_UINT,    X24_TYPELESS_G8_UINT,  UNKNOWN, D24_UNORM_S8_UINT, X24_TYPELESS_G8_UINT);

        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RG8_TYPELESS,            RG8_UNORM, RG8_UNORM, UNKNOWN, RG8_UNORM);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RG8_UNORM,               RG8_UNORM, RG8_UNORM, UNKNOWN, RG8_UNORM);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RG8_UINT,                RG8_UINT,  RG8_UINT,  UNKNOWN, RG8_UINT);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RG8_SNORM,               RG8_SNORM, RG8_SNORM, UNKNOWN, RG8_SNORM);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RG8_SINT,                RG8_SINT,  RG8_SINT,  UNKNOWN, RG8_SINT);

        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_R16_TYPELESS,            R16_FLOAT, R16_FLOAT, UNKNOWN,   R16_FLOAT);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_R16_FLOAT,               R16_FLOAT, R16_FLOAT, UNKNOWN,   R16_FLOAT);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_D16_UNORM,               R16_UNORM, R16_UNORM, D16_UNORM, R16_UNORM);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_R16_UNORM,               R16_UNORM, R16_UNORM, D16_UNORM, R16_UNORM);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_R16_UINT,                R16_UINT,  R16_UINT,  UNKNOWN,   R16_UINT);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_R16_SNORM,               R16_SNORM, R16_SNORM, UNKNOWN,   R16_SNORM);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_R16_SINT,                R16_SINT,  R16_SINT,  UNKNOWN,   R16_SINT);

        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_R8_TYPELESS,             R8_UNORM, R8_UNORM, UNKNOWN, R8_UNORM);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_R8_UNORM,                R8_UNORM, R8_UNORM, UNKNOWN, R8_UNORM);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_R8_UINT,                 R8_UINT,  R8_UINT,  UNKNOWN, R8_UINT);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_R8_SNORM,                R8_SNORM, R8_SNORM, UNKNOWN, R8_SNORM);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_R8_SINT,                 R8_SINT,  R8_SINT,  UNKNOWN, R8_SINT);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_A8_UNORM,                A8_UNORM, A8_UNORM, UNKNOWN, A8_UNORM);

        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_R1_UNORM,                R1_UNORM, R1_UNORM, UNKNOWN, R1_UNORM);

        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RGB9E5_SHAREDEXP,        RGB9E5_SHAREDEXP, RGB9E5_SHAREDEXP, UNKNOWN, RGB9E5_SHAREDEXP);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_RG8_B8G8_UNORM,          RG8_B8G8_UNORM,  RG8_B8G8_UNORM,  UNKNOWN, RG8_B8G8_UNORM);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_G8R8_G8B8_UNORM,         G8R8_G8B8_UNORM, G8R8_G8B8_UNORM, UNKNOWN, G8R8_G8B8_UNORM);

        // http://www.g-truc.net/post-0335.html
        // http://renderingpipeline.com/2012/07/texture-compression/
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_BC1_TYPELESS,            BC1_UNORM_SRGB, UNKNOWN, UNKNOWN, UNKNOWN);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_BC1_UNORM,               BC1_UNORM,      UNKNOWN, UNKNOWN, UNKNOWN);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_BC1_UNORM_SRGB,          BC1_UNORM_SRGB, UNKNOWN, UNKNOWN, UNKNOWN);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_BC2_TYPELESS,            BC2_UNORM_SRGB, UNKNOWN, UNKNOWN, UNKNOWN);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_BC2_UNORM,               BC2_UNORM,      UNKNOWN, UNKNOWN, UNKNOWN);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_BC2_UNORM_SRGB,          BC2_UNORM_SRGB, UNKNOWN, UNKNOWN, UNKNOWN);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_BC3_TYPELESS,            BC3_UNORM_SRGB, UNKNOWN, UNKNOWN, UNKNOWN);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_BC3_UNORM,               BC3_UNORM,      UNKNOWN, UNKNOWN, UNKNOWN);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_BC3_UNORM_SRGB,          BC3_UNORM_SRGB, UNKNOWN, UNKNOWN, UNKNOWN);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_BC4_TYPELESS,            BC4_UNORM,      UNKNOWN, UNKNOWN, UNKNOWN);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_BC4_UNORM,               BC4_UNORM,      UNKNOWN, UNKNOWN, UNKNOWN);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_BC4_SNORM,               BC4_SNORM,      UNKNOWN, UNKNOWN, UNKNOWN);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_BC5_TYPELESS,            BC5_UNORM,      UNKNOWN, UNKNOWN, UNKNOWN);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_BC5_UNORM,               BC5_UNORM,      UNKNOWN, UNKNOWN, UNKNOWN);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_BC5_SNORM,               BC5_SNORM,      UNKNOWN, UNKNOWN, UNKNOWN);

        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_B5G6R5_UNORM,            B5G6R5_UNORM,   B5G6R5_UNORM,    UNKNOWN, B5G6R5_UNORM);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_B5G5R5A1_UNORM,          B5G5R5A1_UNORM, B5G5R5A1_UNORM,  UNKNOWN, B5G5R5A1_UNORM);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_BGRA8_UNORM,             BGRA8_UNORM,    BGRA8_UNORM,     UNKNOWN, BGRA8_UNORM);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_BGRX8_UNORM,             BGRX8_UNORM,    BGRX8_UNORM,     UNKNOWN, BGRX8_UNORM);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_R10G10B10_XR_BIAS_A2_UNORM, R10G10B10_XR_BIAS_A2_UNORM, UNKNOWN, UNKNOWN, UNKNOWN);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_BGRA8_TYPELESS,          BGRA8_UNORM,      BGRA8_UNORM,      UNKNOWN, BGRA8_UNORM);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_BGRA8_UNORM_SRGB,        BGRA8_UNORM_SRGB, BGRA8_UNORM_SRGB, UNKNOWN, BGRA8_UNORM);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_BGRX8_TYPELESS,          BGRX8_UNORM_SRGB, BGRX8_UNORM_SRGB, UNKNOWN, BGRX8_UNORM);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_BGRX8_UNORM_SRGB,        BGRX8_UNORM_SRGB, BGRX8_UNORM_SRGB, UNKNOWN, BGRX8_UNORM);

        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_BC6H_TYPELESS,           BC6H_UF16,      UNKNOWN, UNKNOWN, UNKNOWN);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_BC6H_UF16,               BC6H_UF16,      UNKNOWN, UNKNOWN, UNKNOWN);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_BC6H_SF16,               BC6H_SF16,      UNKNOWN, UNKNOWN, UNKNOWN);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_BC7_TYPELESS,            BC7_UNORM_SRGB, UNKNOWN, UNKNOWN, UNKNOWN);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_BC7_UNORM,               BC7_UNORM,      UNKNOWN, UNKNOWN, UNKNOWN);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_BC7_UNORM_SRGB,          BC7_UNORM_SRGB, UNKNOWN, UNKNOWN, UNKNOWN);

        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_ETC2_RGB8_UNORM,         ETC2_RGB8_UNORM,        UNKNOWN, UNKNOWN, UNKNOWN);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_ETC2_RGB8_UNORM_SRGB,    ETC2_RGB8_UNORM_SRGB,   UNKNOWN, UNKNOWN, UNKNOWN);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_ETC2_RGB8A1_UNORM,       ETC2_RGB8A1_UNORM,      UNKNOWN, UNKNOWN, UNKNOWN);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_ETC2_RGB8A1_UNORM_SRGB,  ETC2_RGB8A1_UNORM_SRGB, UNKNOWN, UNKNOWN, UNKNOWN);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_ETC2_RGBA8_UNORM,        ETC2_RGBA8_UNORM,       UNKNOWN, UNKNOWN, UNKNOWN);
        INIT_TEX_VIEW_FORMAT_INFO(TEX_FORMAT_ETC2_RGBA8_UNORM_SRGB,   ETC2_RGBA8_UNORM_SRGB,  UNKNOWN, UNKNOWN, UNKNOWN);
#undef INIT_TVIEW_FORMAT_INFO
        // clang-format on

        m_ViewFormats[TEX_FORMAT_R8_TYPELESS][TEXTURE_VIEW_SHADING_RATE - 1]  = TEX_FORMAT_R8_UINT;
        m_ViewFormats[TEX_FORMAT_R8_UINT][TEXTURE_VIEW_SHADING_RATE - 1]      = TEX_FORMAT_R8_UINT;
        m_ViewFormats[TEX_FORMAT_RG8_TYPELESS][TEXTURE_VIEW_SHADING_RATE - 1] = TEX_FORMAT_RG8_UNORM;
        m_ViewFormats[TEX_FORMAT_RG8_UNORM][TEXTURE_VIEW_SHADING_RATE - 1]    = TEX_FORMAT_RG8_UNORM;
    }